

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void __thiscall Portal::draw(Portal *this,Graphics *g)

{
  Graphics *g_local;
  Portal *this_local;
  
  if (this->state != CLOSED) {
    piksel::Graphics::push(g);
    piksel::Graphics::imageMode(g,CENTER);
    piksel::Animation::draw
              (&this->animation,g,
               (this->super_AABB).center.field_0.field_0.x - (this->scale * 64.0) / 2.0,
               ((this->super_AABB).center.field_0.field_0.y - (this->scale * 64.0) / 2.0) + 32.0,
               this->scale * 64.0,this->scale * 64.0,false,(bool)(this->flipVertically & 1),true);
    piksel::Graphics::pop(g);
  }
  return;
}

Assistant:

void Portal::draw(piksel::Graphics& g) {
    if (state == CLOSED) {
        return;
    }
    g.push();
    g.imageMode(piksel::DrawMode::CENTER);
    animation.draw(g, center.x - scale * PORTAL_WIDTH / 2, center.y - scale * PORTAL_HEIGHT / 2 + PORTAL_HEIGHT / 2, scale * PORTAL_WIDTH, scale * PORTAL_HEIGHT, false, flipVertically, true);
    g.pop();
}